

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManOrigIdsStart(Gia_Man_t *p)

{
  int nSize;
  Vec_Int_t *pVVar1;
  Gia_Man_t *p_local;
  
  Vec_IntFreeP(&p->vIdsOrig);
  nSize = Gia_ManObjNum(p);
  pVVar1 = Vec_IntStartFull(nSize);
  p->vIdsOrig = pVVar1;
  return;
}

Assistant:

void Gia_ManOrigIdsStart( Gia_Man_t * p )
{
    Vec_IntFreeP( &p->vIdsOrig );
    p->vIdsOrig = Vec_IntStartFull( Gia_ManObjNum(p) );
}